

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_file_stat
                  (mz_zip_archive *pZip,mz_uint file_index,mz_zip_archive_file_stat *pStat)

{
  time_t tVar1;
  uint *in_RDX;
  uint in_ESI;
  long in_RDI;
  mz_uint8 *p;
  mz_uint n;
  uint local_48;
  uint local_44;
  mz_bool local_18;
  long local_8;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x58) == 0)) || (*(uint *)(in_RDI + 0x10) <= in_ESI))
     || (*(int *)(in_RDI + 0x14) != 1)) {
    local_8 = 0;
  }
  else {
    local_8 = **(long **)(in_RDI + 0x58) +
              (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x58) + 0x20) + (ulong)in_ESI * 4);
  }
  if ((local_8 == 0) || (in_RDX == (uint *)0x0)) {
    local_18 = 0;
  }
  else {
    *in_RDX = in_ESI;
    in_RDX[1] = *(uint *)(*(long *)(*(long *)(in_RDI + 0x58) + 0x20) + (ulong)in_ESI * 4);
    *(undefined2 *)(in_RDX + 2) = *(undefined2 *)(local_8 + 4);
    *(undefined2 *)((long)in_RDX + 10) = *(undefined2 *)(local_8 + 6);
    *(undefined2 *)(in_RDX + 3) = *(undefined2 *)(local_8 + 8);
    *(undefined2 *)((long)in_RDX + 0xe) = *(undefined2 *)(local_8 + 10);
    tVar1 = (anonymous_namespace)::miniz::mz_zip_dos_to_time_t
                      ((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    *(time_t *)(in_RDX + 4) = tVar1;
    in_RDX[6] = *(uint *)(local_8 + 0x10);
    *(ulong *)(in_RDX + 8) = (ulong)*(uint *)(local_8 + 0x14);
    *(ulong *)(in_RDX + 10) = (ulong)*(uint *)(local_8 + 0x18);
    *(undefined2 *)(in_RDX + 0xc) = *(undefined2 *)(local_8 + 0x24);
    in_RDX[0xd] = *(uint *)(local_8 + 0x26);
    *(ulong *)(in_RDX + 0xe) = (ulong)*(uint *)(local_8 + 0x2a);
    local_44 = (uint)*(ushort *)(local_8 + 0x1c);
    if (0x102 < local_44) {
      local_44 = 0x103;
    }
    memcpy(in_RDX + 0x11,(void *)(local_8 + 0x2e),(ulong)local_44);
    *(undefined1 *)((long)in_RDX + (ulong)local_44 + 0x44) = 0;
    local_48 = (uint)*(ushort *)(local_8 + 0x20);
    if (0xfe < local_48) {
      local_48 = 0xff;
    }
    in_RDX[0x10] = local_48;
    memcpy(in_RDX + 0x52,
           (void *)(local_8 + 0x2e + (ulong)*(ushort *)(local_8 + 0x1c) +
                   (ulong)*(ushort *)(local_8 + 0x1e)),(ulong)local_48);
    *(undefined1 *)((long)in_RDX + (ulong)local_48 + 0x148) = 0;
    local_18 = 1;
  }
  return local_18;
}

Assistant:

mz_bool mz_zip_reader_file_stat(mz_zip_archive *pZip, mz_uint file_index,
                                mz_zip_archive_file_stat *pStat) {
  mz_uint n;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if ((!p) || (!pStat))
    return MZ_FALSE;

  // Unpack the central directory record.
  pStat->m_file_index = file_index;
  pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(
      &pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
  pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
  pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
  pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
  pStat->m_time =
      mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS),
                           MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
  pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
  pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
  pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
  pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
  pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
  pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

  // Copy as much of the filename and comment as possible.
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
  memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
  pStat->m_filename[n] = '\0';

  n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
  pStat->m_comment_size = n;
  memcpy(pStat->m_comment, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS),
         n);
  pStat->m_comment[n] = '\0';

  return MZ_TRUE;
}